

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

ScenarioUpperBound * __thiscall
despot::Pocman::CreateScenarioUpperBound(Pocman *this,string *name,string particle_bound_name)

{
  int iVar1;
  ParticleUpperBound *this_00;
  undefined **ppuVar2;
  ostream *poVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (ParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_00 = (ParticleUpperBound *)operator_new(0x10);
      despot::ScenarioUpperBound::ScenarioUpperBound((ScenarioUpperBound *)this_00);
      ppuVar2 = &PTR__ScenarioUpperBound_00113b38;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar3 = std::operator<<(poVar3,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar3);
          exit(1);
        }
      }
      this_00 = (ParticleUpperBound *)operator_new(0x10);
      despot::ParticleUpperBound::ParticleUpperBound(this_00);
      ppuVar2 = &PTR__ParticleUpperBound_00113b80;
    }
    *(undefined ***)this_00 = ppuVar2;
    *(Pocman **)(this_00 + 8) = this;
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* Pocman::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "APPROX") {
		return new PocmanApproxScenarioUpperBound(this);
	} else if (name == "SMART" || name == "DEFAULT") {
		return new PocmanSmartParticleUpperBound(this);
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}